

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadModel(FastText *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  invalid_argument *piVar3;
  string *in_RSI;
  ifstream ifs;
  istream *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  char *__rhs;
  undefined6 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  undefined1 uVar4;
  string local_270 [39];
  undefined1 local_249;
  string local_248 [48];
  char local_218 [192];
  istream *in_stack_fffffffffffffea8;
  FastText *in_stack_fffffffffffffeb0;
  
  __rhs = local_218;
  std::ifstream::ifstream(__rhs,in_RSI,_S_bin);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_249 = 1;
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd8f,CONCAT16(bVar1,in_stack_fffffffffffffd88)),
                   __rhs);
    std::invalid_argument::invalid_argument(piVar3,local_248);
    local_249 = 0;
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar2 = checkModel((FastText *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     in_stack_fffffffffffffd60);
  if (!bVar2) {
    uVar4 = 1;
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar4,CONCAT16(bVar1,in_stack_fffffffffffffd88)),__rhs);
    std::invalid_argument::invalid_argument(piVar3,local_270);
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  loadModel(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::ifstream::close();
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void FastText::loadModel(const std::string& filename) {
	std::ifstream ifs(filename, std::ifstream::binary);
	if (!ifs.is_open()) {
		throw std::invalid_argument(filename + " cannot be opened for loading!");
	}
	if (!checkModel(ifs)) {
		throw std::invalid_argument(filename + " has wrong file format!");
	}
	loadModel(ifs);
	ifs.close();
}